

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O2

Aig_Man_t *
Saig_ManDupDual(Aig_Man_t *pAig,Vec_Int_t *vDcFlops,int nDualPis,int fDualFfs,int fMiterFfs,
               int fComplPo,int fCheckZero,int fCheckOne)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  void **__s;
  Aig_Man_t *pAigNew;
  size_t sVar5;
  char *__dest;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  Aig_Man_t *pAVar13;
  Aig_Obj_t *local_90;
  Aig_Obj_t *local_88;
  Aig_Man_t *local_80;
  Vec_Ptr_t *local_78;
  int local_6c;
  ulong local_68;
  int local_60;
  int local_5c;
  Vec_Int_t *local_58;
  ulong local_50;
  Aig_Obj_t *local_48;
  Aig_Obj_t *pTemp3;
  Aig_Obj_t *pTemp2;
  
  local_80 = pAig;
  if (pAig->nTruePos < 1) {
    pcVar11 = "Saig_ManPoNum(pAig) > 0";
    uVar12 = 0x57;
  }
  else if ((nDualPis < 0) || (pAig->nTruePis < nDualPis)) {
    pcVar11 = "nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig)";
    uVar12 = 0x58;
  }
  else {
    if ((vDcFlops == (Vec_Int_t *)0x0) || (vDcFlops->nSize == pAig->nRegs)) {
      pAVar7 = (Aig_Obj_t *)(ulong)(uint)fComplPo;
      lVar10 = (long)pAig->vObjs->nSize - (long)pAig->nDeleted;
      iVar3 = (int)lVar10 * 2;
      local_78 = (Vec_Ptr_t *)malloc(0x10);
      iVar4 = 8;
      if (6 < iVar3 - 1U) {
        iVar4 = iVar3;
      }
      local_78->nCap = iVar4;
      local_68 = CONCAT44(local_68._4_4_,fDualFfs);
      local_5c = nDualPis;
      if (iVar4 == 0) {
        __s = (void **)0x0;
      }
      else {
        __s = (void **)malloc((long)iVar4 << 3);
      }
      local_78->pArray = __s;
      local_78->nSize = iVar3;
      uVar12 = 0;
      memset(__s,0,lVar10 * 0x10);
      pAVar13 = local_80;
      pAigNew = Aig_ManStart(local_80->nObjs[6] + local_80->nObjs[5]);
      pcVar11 = pAVar13->pName;
      local_6c = fComplPo;
      local_60 = fMiterFfs;
      local_58 = vDcFlops;
      if (pcVar11 == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar5 = strlen(pcVar11);
        __dest = (char *)malloc(sVar5 + 1);
        strcpy(__dest,pcVar11);
      }
      pVVar2 = local_78;
      pAigNew->pName = __dest;
      Saig_ObjSetDual(local_78,0,0,(Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1));
      Saig_ObjSetDual(pVVar2,0,1,pAigNew->pConst1);
      local_50 = (ulong)((int)local_68 == 0);
      while( true ) {
        pVVar2 = local_78;
        pAVar13 = local_80;
        if (local_80->vCis->nSize <= (int)uVar12) break;
        pvVar6 = Vec_PtrEntry(local_80->vCis,uVar12);
        local_68 = (ulong)uVar12;
        if ((int)uVar12 < local_5c) {
          pAVar7 = Aig_ObjCreateCi(pAigNew);
          pAVar8 = Aig_ObjCreateCi(pAigNew);
        }
        else {
          iVar3 = pAVar13->nTruePis;
          pAVar9 = Aig_ObjCreateCi(pAigNew);
          if ((int)uVar12 < iVar3) {
            pAVar7 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
            pAVar8 = pAVar9;
          }
          else {
            pAVar8 = Aig_ObjCreateCi(pAigNew);
            uVar1 = local_50;
            if (local_58 != (Vec_Int_t *)0x0) {
              iVar3 = Vec_IntEntry(local_58,uVar12 - local_80->nTruePis);
              uVar1 = (ulong)(iVar3 == 0);
            }
            pAVar7 = (Aig_Obj_t *)(uVar1 ^ (ulong)pAVar9);
          }
        }
        iVar3 = *(int *)((long)pvVar6 + 0x24);
        pAVar9 = Aig_And(pAigNew,pAVar7,(Aig_Obj_t *)((ulong)pAVar8 ^ 1));
        pVVar2 = local_78;
        Saig_ObjSetDual(local_78,iVar3,0,pAVar9);
        iVar3 = *(int *)((long)pvVar6 + 0x24);
        local_48 = pAVar8;
        pAVar9 = Aig_And(pAigNew,pAVar8,(Aig_Obj_t *)((ulong)pAVar7 ^ 1));
        Saig_ObjSetDual(pVVar2,iVar3,1,pAVar9);
        uVar12 = (int)local_68 + 1;
      }
      local_90 = local_48;
      local_88 = pAVar7;
      for (iVar3 = 0; iVar4 = local_6c, iVar3 < pAVar13->vObjs->nSize; iVar3 = iVar3 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAVar13->vObjs,iVar3);
        if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
          Saig_ObjDualFanin(pAigNew,pVVar2,pAVar7,0,&local_88,&local_90);
          Saig_ObjDualFanin(pAigNew,pVVar2,pAVar7,1,&pTemp2,&pTemp3);
          iVar4 = pAVar7->Id;
          pAVar9 = Aig_Or(pAigNew,local_88,pTemp2);
          Saig_ObjSetDual(pVVar2,iVar4,0,pAVar9);
          iVar4 = pAVar7->Id;
          pAVar7 = Aig_And(pAigNew,local_90,pTemp3);
          pAVar13 = local_80;
          Saig_ObjSetDual(pVVar2,iVar4,1,pAVar7);
        }
      }
      pAVar7 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
      if (local_60 == 0) {
        for (iVar3 = 0; iVar3 < pAVar13->nTruePos; iVar3 = iVar3 + 1) {
          pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pAVar13->vCos,iVar3);
          Saig_ObjDualFanin(pAigNew,local_78,pAVar9,0,&local_88,&local_90);
          pAVar9 = local_88;
          if ((fCheckZero != 0) ||
             (pAVar9 = (Aig_Obj_t *)((ulong)local_88 ^ 1), pAVar8 = local_90, fCheckOne == 0)) {
            pAVar8 = (Aig_Obj_t *)((ulong)local_90 ^ 1);
          }
          pAVar9 = Aig_And(pAigNew,pAVar9,pAVar8);
          pAVar7 = Aig_Or(pAigNew,pAVar7,pAVar9);
        }
      }
      else {
        for (iVar3 = 0; pAVar13 = local_80, iVar3 < local_80->nRegs; iVar3 = iVar3 + 1) {
          pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(local_80->vCos,local_80->nTruePos + iVar3);
          Saig_ObjDualFanin(pAigNew,local_78,pAVar9,0,&local_88,&local_90);
          pAVar9 = local_88;
          if ((fCheckZero != 0) ||
             (pAVar9 = (Aig_Obj_t *)((ulong)local_88 ^ 1), pAVar8 = local_90, fCheckOne == 0)) {
            pAVar8 = (Aig_Obj_t *)((ulong)local_90 ^ 1);
          }
          pAVar9 = Aig_And(pAigNew,pAVar9,pAVar8);
          pAVar7 = Aig_Or(pAigNew,pAVar7,pAVar9);
        }
      }
      Aig_ObjCreateCo(pAigNew,(Aig_Obj_t *)((long)iVar4 ^ (ulong)pAVar7));
      p = local_58;
      for (iVar3 = 0; iVar3 < pAVar13->nRegs; iVar3 = iVar3 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAVar13->vCos,pAVar13->nTruePos + iVar3);
        Saig_ObjDualFanin(pAigNew,local_78,pAVar7,0,&local_88,&local_90);
        pAVar7 = local_88;
        uVar1 = local_50;
        if (p != (Vec_Int_t *)0x0) {
          iVar4 = Vec_IntEntry(p,iVar3);
          uVar1 = (ulong)(iVar4 == 0);
        }
        local_88 = (Aig_Obj_t *)(uVar1 ^ (ulong)pAVar7);
        Aig_ObjCreateCo(pAigNew,local_88);
        Aig_ObjCreateCo(pAigNew,local_90);
        pAVar13 = local_80;
      }
      Aig_ManSetRegNum(pAigNew,pAVar13->nRegs * 2);
      Aig_ManCleanup(pAigNew);
      pVVar2 = local_78;
      free(local_78->pArray);
      free(pVVar2);
      return pAigNew;
    }
    pcVar11 = "vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig)";
    uVar12 = 0x59;
  }
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                ,uVar12,
                "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
               );
}

Assistant:

Aig_Man_t * Saig_ManDupDual( Aig_Man_t * pAig, Vec_Int_t * vDcFlops, int nDualPis, int fDualFfs, int fMiterFfs, int fComplPo, int fCheckZero, int fCheckOne )
{
    Vec_Ptr_t * vCopies;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pTemp0, * pTemp1, * pTemp2, * pTemp3, * pCare, * pMiter;
    int i;
    assert( Saig_ManPoNum(pAig) > 0 );
    assert( nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig) );
    assert( vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig) );
    vCopies = Vec_PtrStart( 2*Aig_ManObjNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Saig_ObjSetDual( vCopies, 0, 0, Aig_ManConst0(pAigNew) );
    Saig_ObjSetDual( vCopies, 0, 1, Aig_ManConst1(pAigNew) );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( i < nDualPis )
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
        }
        else if ( i < Saig_ManPiNum(pAig) )
        {
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            pTemp0 = Aig_Not( pTemp1 );
        }
        else
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            if ( vDcFlops )
                pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i-Saig_ManPiNum(pAig)) );
            else
                pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        }
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_And(pAigNew, pTemp0, Aig_Not(pTemp1)) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, Aig_Not(pTemp0)) );
    }
    // create internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 1, &pTemp2, &pTemp3 );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_Or (pAigNew, pTemp0, pTemp2) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, pTemp3) );
    }
    // create miter and flops
    pMiter = Aig_ManConst0(pAigNew);
    if ( fMiterFfs )
    {
        Saig_ManForEachLi( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    // create PO
    pMiter = Aig_NotCond( pMiter, fComplPo );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // create flops
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        if ( vDcFlops )
            pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i) );
        else
            pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        Aig_ObjCreateCo( pAigNew, pTemp0 );
        Aig_ObjCreateCo( pAigNew, pTemp1 );
    }
    // set the flops
    Aig_ManSetRegNum( pAigNew, 2 * Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Vec_PtrFree( vCopies );
    return pAigNew;
}